

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O3

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::funcFromModel
          (LLVMReadWriteGraphBuilder *this,FunctionModel *model,CallInst *CInst)

{
  ulong uVar1;
  LLVMPointsToSetImpl *pLVar2;
  bool bVar3;
  char cVar4;
  op_iterator pUVar5;
  raw_ostream *prVar6;
  Value *val;
  RWNode *pRVar7;
  Offset OVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  Offset OVar12;
  ulong uVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  undefined1 auVar16 [16];
  pair<dg::Offset,_dg::Offset> pVar17;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  const_iterator __begin3;
  const_iterator __end3;
  const_iterator local_a8;
  RWNode *local_a0;
  FunctionModel *local_98;
  LLVMReadWriteGraphBuilder *local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  const_iterator local_78;
  char local_70 [8];
  LLVMPointsToSetImpl *local_68;
  GenericDefSite<dg::dda::RWNode> local_60;
  _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
  *local_48;
  CallInst *local_40;
  RWNode *local_38;
  
  local_90 = this;
  local_a0 = ReadWriteGraph::create(&this->graph,GENERIC);
  pUVar5 = llvm::CallBase::arg_end((CallBase *)CInst);
  uVar1 = Offset::UNKNOWN;
  if ((int)((ulong)((long)pUVar5 -
                   (long)(CInst + (ulong)-(*(uint *)(CInst + 0x14) & 0x7ffffff) * 0x20)) >> 5) != 0)
  {
    local_80 = &(model->_defines)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_88 = &(model->_uses)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_48 = (_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                *)&(local_a0->annotations).uses;
    uVar13 = 0;
    local_98 = model;
    local_40 = CInst;
    do {
      bVar3 = FunctionModel::handles(model,(uint)uVar13);
      if (bVar3) {
        (**(code **)(*(long *)local_90->PTA + 0x10))
                  (local_70,local_90->PTA,
                   *(undefined8 *)
                    (CInst + (uVar13 * 0x20 - (ulong)(uint)(*(int *)(CInst + 0x14) << 5))));
        pLVar2 = local_68;
        if (local_70[0] == '\0') {
          prVar6 = (raw_ostream *)llvm::errs();
          Str.Length = 0x34;
          Str.Data = "[Warning]: did not find pt-set for modeled function\n";
          llvm::raw_ostream::operator<<(prVar6,Str);
          prVar6 = (raw_ostream *)llvm::errs();
          Str_00.Length = 0x11;
          Str_00.Data = "           Func: ";
          prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_00);
          prVar6 = (raw_ostream *)
                   llvm::raw_ostream::write((char *)prVar6,(ulong)(model->name)._M_dataplus._M_p);
          Str_01.Length = 10;
          Str_01.Data = ", operand ";
          prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_01);
          prVar6 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar6,uVar13);
          Str_02.Length = 1;
          Str_02.Data = "\n";
          llvm::raw_ostream::operator<<(prVar6,Str_02);
        }
        else {
          if (local_68 == (LLVMPointsToSetImpl *)0x0) {
            local_a8.impl = (LLVMPointsToSetImpl *)0x0;
          }
          else {
            cVar4 = (**(code **)(*(long *)local_68 + 0x38))(local_68);
            local_a8.impl = (LLVMPointsToSetImpl *)0x0;
            if (cVar4 == '\0') {
              local_a8.impl = pLVar2;
            }
          }
          local_78.impl = (LLVMPointsToSetImpl *)0x0;
          bVar3 = LLVMPointsToSet::const_iterator::operator==(&local_a8,&local_78);
          model = local_98;
          while (!bVar3) {
            auVar16 = (**(code **)(*(long *)local_a8.impl + 0x48))();
            uVar11 = auVar16._8_8_;
            val = auVar16._0_8_;
            if (val[0x10] != (Value)0x0) {
              pRVar7 = getOperand(local_90,val);
              p_Var15 = (model->_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var14 = local_80;
              if (p_Var15 != (_Base_ptr)0x0) {
                do {
                  if (uVar13 <= p_Var15[1]._M_color) {
                    p_Var14 = p_Var15;
                  }
                  p_Var15 = (&p_Var15->_M_left)[p_Var15[1]._M_color < uVar13];
                } while (p_Var15 != (_Base_ptr)0x0);
                if ((p_Var14 != local_80) && (p_Var14[1]._M_color <= uVar13)) {
                  local_38 = pRVar7;
                  pVar17 = getFromTo<dg::FunctionModel::Operand_const*>
                                     (CInst,(Operand *)&p_Var14[1]._M_parent);
                  OVar12 = pVar17.second.offset;
                  OVar8 = pVar17.first.offset;
                  lVar9 = (**(code **)(*(long *)local_68 + 0x20))();
                  pRVar7 = local_38;
                  if ((lVar9 == 1) && (uVar11 != uVar1)) {
                    lVar9 = 0xa0;
                    uVar10 = uVar1 - OVar8.offset;
                    if ((((uVar10 != 0) && (uVar11 < uVar10)) && (uVar1 != OVar12.offset)) &&
                       ((uVar11 < uVar1 - OVar12.offset && (lVar9 = 0xd0, val[0x10] == (Value)0x53))
                       )) {
                      lVar9 = 0xa0;
                    }
                  }
                  else {
                    uVar10 = uVar1 - OVar8.offset;
                    lVar9 = 0xa0;
                  }
                  local_60.len.offset = OVar12.offset + uVar11;
                  if (uVar1 - OVar12.offset <= uVar11) {
                    local_60.len.offset = uVar1;
                  }
                  if (uVar1 == OVar12.offset) {
                    local_60.len.offset = uVar1;
                  }
                  local_60.offset.offset = OVar8.offset + uVar11;
                  if (uVar10 <= uVar11) {
                    local_60.offset.offset = uVar1;
                  }
                  if (uVar1 == OVar8.offset) {
                    local_60.offset.offset = uVar1;
                  }
                  if (uVar11 == uVar1) {
                    local_60.len.offset = uVar1;
                    local_60.offset.offset = uVar1;
                  }
                  local_60.target = local_38;
                  std::
                  _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                  ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
                            ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                              *)((long)&local_a0->_vptr_RWNode + lVar9),&local_60);
                  model = local_98;
                  CInst = local_40;
                }
              }
              p_Var15 = (model->_uses)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var14 = local_88;
              if (p_Var15 != (_Base_ptr)0x0) {
                do {
                  if (uVar13 <= p_Var15[1]._M_color) {
                    p_Var14 = p_Var15;
                  }
                  p_Var15 = (&p_Var15->_M_left)[p_Var15[1]._M_color < uVar13];
                } while (p_Var15 != (_Base_ptr)0x0);
                if ((p_Var14 != local_88) && (p_Var14[1]._M_color <= uVar13)) {
                  pVar17 = getFromTo<dg::FunctionModel::Operand_const*>
                                     (CInst,(Operand *)&p_Var14[1]._M_parent);
                  OVar12 = pVar17.second.offset;
                  OVar8 = pVar17.first.offset;
                  local_60.len.offset = OVar12.offset + uVar11;
                  if (uVar1 - OVar12.offset <= uVar11) {
                    local_60.len.offset = uVar1;
                  }
                  if (uVar1 == OVar12.offset) {
                    local_60.len.offset = uVar1;
                  }
                  local_60.offset.offset = OVar8.offset + uVar11;
                  if (uVar1 - OVar8.offset <= uVar11) {
                    local_60.offset.offset = uVar1;
                  }
                  if (uVar1 == OVar8.offset) {
                    local_60.offset.offset = uVar1;
                  }
                  if (uVar11 == uVar1) {
                    local_60.len.offset = uVar1;
                    local_60.offset.offset = uVar1;
                  }
                  local_60.target = pRVar7;
                  std::
                  _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                  ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
                            (local_48,&local_60);
                }
              }
            }
            (**(code **)(*(long *)local_a8.impl + 0x40))();
            cVar4 = (**(code **)(*(long *)local_a8.impl + 0x38))();
            if (cVar4 != '\0') {
              local_a8.impl = (LLVMPointsToSetImpl *)0x0;
            }
            bVar3 = LLVMPointsToSet::const_iterator::operator==(&local_a8,&local_78);
          }
        }
        if (local_68 != (LLVMPointsToSetImpl *)0x0) {
          (**(code **)(*(long *)local_68 + 0x58))();
        }
      }
      uVar13 = uVar13 + 1;
      pUVar5 = llvm::CallBase::arg_end((CallBase *)CInst);
    } while (uVar13 < ((ulong)((long)pUVar5 -
                              (long)((CallBase *)CInst +
                                    (ulong)-(*(uint *)((CallBase *)CInst + 0x14) & 0x7ffffff) * 0x20
                                    )) >> 5 & 0xffffffff));
  }
  return local_a0;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::funcFromModel(const FunctionModel *model,
                                                 const llvm::CallInst *CInst) {
    RWNode *node = &create(RWNodeType::GENERIC);

    for (unsigned int i = 0; i < llvmutils::getNumArgOperands(CInst); ++i) {
        if (!model->handles(i))
            continue;

        auto *const llvmOp = CInst->getArgOperand(i);
        auto pts = PTA->getLLVMPointsToChecked(llvmOp);
        // if we do not have a pts, this is not pointer
        // relevant instruction. We must do it this way
        // instead of type checking, due to the inttoptr.
        if (!pts.first) {
            llvm::errs()
                    << "[Warning]: did not find pt-set for modeled function\n";
            llvm::errs() << "           Func: " << model->name << ", operand "
                         << i << "\n";
            continue;
        }

        for (const auto &ptr : pts.second) {
            if (llvm::isa<llvm::Function>(ptr.value))
                // functions may not be redefined
                continue;

            RWNode *target = getOperand(ptr.value);
            assert(target && "Don't have pointer target for call argument");

            Offset from, to;
            if (const auto *defines = model->defines(i)) {
                std::tie(from, to) = getFromTo(CInst, defines);
                // this call may define this memory
                bool strong_updt = pts.second.size() == 1 &&
                                   !ptr.offset.isUnknown() &&
                                   !(ptr.offset + from).isUnknown() &&
                                   !(ptr.offset + to).isUnknown() &&
                                   !llvm::isa<llvm::CallInst>(ptr.value);
                // FIXME: what about vars in recursive functions?
                node->addDef(target, ptr.offset + from, ptr.offset + to,
                             strong_updt);
            }
            if (const auto *uses = model->uses(i)) {
                std::tie(from, to) = getFromTo(CInst, uses);
                // this call uses this memory
                node->addUse(target, ptr.offset + from, ptr.offset + to);
            }
        }
    }

    return node;
}